

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye_model.hpp
# Opt level: O0

void __thiscall
FisheyeModel::setUndistortParams
          (FisheyeModel *this,int undist_flags,Size *undist_size,double undist_scale,
          Point2f *undist_offset)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  _InputArray *p_Var4;
  float *pfVar5;
  ostream *poVar6;
  double local_198;
  Size_<int> *local_180;
  _OutputArray local_168;
  _OutputArray local_150;
  _InputArray local_138;
  _InputArray local_120;
  _InputArray local_108;
  _OutputArray local_f0;
  _InputArray local_d8;
  _InputArray local_c0;
  Size_<int> local_98;
  undefined1 local_90 [8];
  Mat new_camera_matrix;
  Point2f *undist_offset_local;
  double undist_scale_local;
  Size *undist_size_local;
  int undist_flags_local;
  FisheyeModel *this_local;
  
  new_camera_matrix.step.buf[1] = (size_t)undist_offset;
  cv::Mat::Mat((Mat *)local_90);
  cv::Size_<int>::Size_(&local_98,0,0);
  bVar3 = cv::operator==(undist_size,&local_98);
  local_180 = undist_size;
  if (bVar3) {
    local_180 = &(this->super_BaseModel).imageSize;
  }
  cv::Size_<int>::operator=(&(this->super_BaseModel).undistortSize,local_180);
  cv::_InputArray::_InputArray(&local_c0,&(this->super_BaseModel).cameraMatrix);
  cv::_InputArray::_InputArray(&local_d8,&(this->super_BaseModel).distortCoeffs);
  p_Var4 = (_InputArray *)cv::noArray();
  cv::_OutputArray::_OutputArray(&local_f0,(Mat *)local_90);
  cv::fisheye::estimateNewCameraMatrixForUndistortRectify
            (&local_c0,&local_d8,(Size_ *)&(this->super_BaseModel).imageSize,p_Var4,&local_f0,0.0,
             (Size_ *)&(this->super_BaseModel).undistortSize,1.0);
  cv::_OutputArray::~_OutputArray(&local_f0);
  cv::_InputArray::~_InputArray(&local_d8);
  cv::_InputArray::~_InputArray(&local_c0);
  local_198 = undist_scale;
  if ((undist_scale == 0.0) && (!NAN(undist_scale))) {
    local_198 = 1.0;
  }
  (this->super_BaseModel).undistortScale = local_198;
  dVar2 = (this->super_BaseModel).undistortScale;
  pfVar5 = cv::Mat::at<float>((Mat *)local_90,0,0);
  *pfVar5 = (float)((double)*pfVar5 * dVar2);
  dVar2 = (this->super_BaseModel).undistortScale;
  pfVar5 = cv::Mat::at<float>((Mat *)local_90,1,1);
  *pfVar5 = (float)((double)*pfVar5 * dVar2);
  cv::Point_<float>::operator=
            (&(this->super_BaseModel).undistortOffset,(Point_<float> *)new_camera_matrix.step.buf[1]
            );
  fVar1 = (this->super_BaseModel).undistortOffset.x;
  pfVar5 = cv::Mat::at<float>((Mat *)local_90,0,2);
  *pfVar5 = *pfVar5 + fVar1;
  fVar1 = (this->super_BaseModel).undistortOffset.y;
  pfVar5 = cv::Mat::at<float>((Mat *)local_90,1,2);
  *pfVar5 = *pfVar5 + fVar1;
  poVar6 = std::operator<<((ostream *)&std::cout,"=== new_camera_matrix ===\n");
  poVar6 = cv::operator<<(poVar6,(Mat *)local_90);
  std::operator<<(poVar6,"\n");
  cv::_InputArray::_InputArray(&local_108,&(this->super_BaseModel).cameraMatrix);
  cv::_InputArray::_InputArray(&local_120,&(this->super_BaseModel).distortCoeffs);
  p_Var4 = (_InputArray *)cv::noArray();
  cv::_InputArray::_InputArray(&local_138,(Mat *)local_90);
  cv::_OutputArray::_OutputArray(&local_150,&(this->super_BaseModel).xMap);
  cv::_OutputArray::_OutputArray(&local_168,&(this->super_BaseModel).yMap);
  cv::fisheye::initUndistortRectifyMap
            (&local_108,&local_120,p_Var4,&local_138,(Size_ *)&(this->super_BaseModel).undistortSize
             ,5,&local_150,&local_168);
  cv::_OutputArray::~_OutputArray(&local_168);
  cv::_OutputArray::~_OutputArray(&local_150);
  cv::_InputArray::~_InputArray(&local_138);
  cv::_InputArray::~_InputArray(&local_120);
  cv::_InputArray::~_InputArray(&local_108);
  cv::Mat::~Mat((Mat *)local_90);
  return;
}

Assistant:

void setUndistortParams(
    const int undist_flags=0,
    const cv::Size& undist_size=cv::Size(0,0),
    const double undist_scale=0.9,
    const cv::Point2f& undist_offset=cv::Point2f(0,0)
  ) {
    cv::Mat new_camera_matrix;

    this->undistortSize = (undist_size == cv::Size(0,0) ? this->imageSize : undist_size);
    cv::fisheye::estimateNewCameraMatrixForUndistortRectify(
      this->cameraMatrix,
      this->distortCoeffs,
      this->imageSize,
      cv::noArray(),
      new_camera_matrix,
      0,
      this->undistortSize,
      1.0
    );

    this->undistortScale = (undist_scale == 0 ? 1.0 : undist_scale);
    new_camera_matrix.at<float>(0,0) *= this->undistortScale;
    new_camera_matrix.at<float>(1,1) *= this->undistortScale;
    
    this->undistortOffset = undist_offset;
    new_camera_matrix.at<float>(0,2) += this->undistortOffset.x;
    new_camera_matrix.at<float>(1,2) += this->undistortOffset.y;

    std::cout << "=== new_camera_matrix ===\n" << new_camera_matrix << "\n";
    
    cv::fisheye::initUndistortRectifyMap(
      this->cameraMatrix,
      this->distortCoeffs,
      cv::noArray(),
      new_camera_matrix,
      this->undistortSize,
      CV_32FC1,
      this->xMap,
      this->yMap
    );
  }